

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O0

void capnp::_::
     checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Builder,_capnp::List<capnp::Text,_(capnp::Kind)1>,_false>
               (Builder reader,initializer_list<capnp::Text::Reader> expected)

{
  Reader a;
  uint uVar1;
  size_type sVar2;
  ulong uVar3;
  const_iterator pRVar4;
  Builder local_78;
  ArrayPtr<const_char> local_60;
  char *local_50;
  size_t local_48;
  uint local_40;
  uint i;
  uint local_2c;
  size_type local_28;
  Fault local_20;
  Fault f;
  initializer_list<capnp::Text::Reader> expected_local;
  
  f.exception = (Exception *)expected._M_array;
  sVar2 = std::initializer_list<capnp::Text::Reader>::size
                    ((initializer_list<capnp::Text::Reader> *)&f);
  uVar1 = List<capnp::Text,_(capnp::Kind)1>::Builder::size(&reader);
  if (sVar2 == uVar1) {
    local_40 = 0;
    while( true ) {
      uVar3 = (ulong)local_40;
      sVar2 = std::initializer_list<capnp::Text::Reader>::size
                        ((initializer_list<capnp::Text::Reader> *)&f);
      if (sVar2 <= uVar3) break;
      pRVar4 = std::initializer_list<capnp::Text::Reader>::begin
                         ((initializer_list<capnp::Text::Reader> *)&f);
      local_50 = pRVar4[local_40].super_StringPtr.content.ptr;
      local_48 = pRVar4[local_40].super_StringPtr.content.size_;
      List<capnp::Text,_(capnp::Kind)1>::Builder::operator[](&local_78,&reader,local_40);
      local_60 = (ArrayPtr<const_char>)Text::Builder::operator_cast_to_Reader(&local_78);
      a.super_StringPtr.content.size_ = local_48;
      a.super_StringPtr.content.ptr = local_50;
      checkElement<capnp::Text::Reader>(a,(Reader)local_60);
      local_40 = local_40 + 1;
    }
    return;
  }
  local_28 = std::initializer_list<capnp::Text::Reader>::size
                       ((initializer_list<capnp::Text::Reader> *)&f);
  local_2c = List<capnp::Text,_(capnp::Kind)1>::Builder::size(&reader);
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_long,unsigned_int>
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.h"
             ,0x89,FAILED,"(expected.size()) == (reader.size())","expected.size(), reader.size()",
             &local_28,&local_2c);
  kj::_::Debug::Fault::fatal(&local_20);
}

Assistant:

void checkList(T reader, std::initializer_list<decltype(typename L::Reader()[0])> expected) {
  ASSERT_EQ(expected.size(), reader.size());
  for (uint i = 0; i < expected.size(); i++) {
    checkElement<decltype(typename L::Reader()[0])>(expected.begin()[i], reader[i]);
  }
}